

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O2

int __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::ContainsVertexSign
          (DegeneracyFinder *this,VertexId v0)

{
  pointer pVVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Edge *edge;
  pointer ppVar7;
  S2ContainsVertexQuery query;
  
  lVar6 = (long)v0;
  pVVar1 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  query.target_.c_[2] = pVVar1[lVar6].c_[2];
  pVVar1 = pVVar1 + lVar6;
  query.target_.c_[0] = pVVar1->c_[0];
  query.target_.c_[1] = pVVar1->c_[1];
  query.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  query.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            )(Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
  query.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)piVar2[lVar6];
  ppVar7 = (((this->out_).edges_)->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start + lVar5;
  for (lVar5 = (long)piVar2[lVar6 + 1] * 8 + lVar5 * -8; lVar5 != 0; lVar5 = lVar5 + -8) {
    S2ContainsVertexQuery::AddEdge
              (&query,(this->g_->vertices_->
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                      _M_impl.super__Vector_impl_data._M_start + ppVar7->second,1);
    ppVar7 = ppVar7 + 1;
  }
  piVar2 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = piVar3[lVar6 + 1];
  for (lVar5 = (long)piVar3[lVar6] << 2; (long)iVar4 * 4 != lVar5; lVar5 = lVar5 + 4) {
    S2ContainsVertexQuery::AddEdge
              (&query,(this->g_->vertices_->
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->g_->edges_->
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[*(int *)((long)piVar2 + lVar5)].
                      first,-1);
  }
  iVar4 = S2ContainsVertexQuery::ContainsSign(&query);
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  ::~btree((btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
            *)&query.edge_map_);
  return iVar4;
}

Assistant:

int DegeneracyFinder::ContainsVertexSign(VertexId v0) const {
  S2ContainsVertexQuery query(g_.vertex(v0));
  for (const Edge& edge : out_.edges(v0)) {
    query.AddEdge(g_.vertex(edge.second), 1);
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    query.AddEdge(g_.vertex(g_.edge(e).first), -1);
  }
  return query.ContainsSign();
}